

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringAnisotropyTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::texture::anon_unknown_0::FilteringAnisotropyTests::createInstance
          (FilteringAnisotropyTests *this,Context *context)

{
  WrapMode *pWVar1;
  undefined8 uVar2;
  SamplerType SVar3;
  undefined4 uVar4;
  TestInstance *pTVar5;
  TextureFormat format;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar6;
  Sampler *pSVar7;
  WrapMode *pWVar8;
  byte bVar9;
  float fVar10;
  undefined1 local_358 [52];
  Context *local_324;
  float local_120;
  
  bVar9 = 0;
  pTVar5 = (TestInstance *)operator_new(0xb8);
  pTVar5->m_context = context;
  pTVar5->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d39730;
  *(deUint32 *)&pTVar5[1].m_context =
       (this->m_refParams).super_ReferenceParams.super_RenderParams.flags;
  pTVar5[1]._vptr_TestInstance =
       *(_func_int ***)&(this->m_refParams).super_ReferenceParams.super_RenderParams;
  uVar2 = *(undefined8 *)((this->m_refParams).super_ReferenceParams.super_RenderParams.w.m_data + 2)
  ;
  *(undefined8 *)((long)&pTVar5[1].m_context + 4) =
       *(undefined8 *)(this->m_refParams).super_ReferenceParams.super_RenderParams.w.m_data;
  *(undefined8 *)((long)&pTVar5[2]._vptr_TestInstance + 4) = uVar2;
  *(undefined8 *)((long)&pTVar5[2].m_context + 4) =
       *(undefined8 *)&(this->m_refParams).super_ReferenceParams.super_RenderParams.bias;
  uVar2 = *(undefined8 *)
           ((this->m_refParams).super_ReferenceParams.super_RenderParams.colorScale.m_data + 2);
  *(undefined8 *)((long)&pTVar5[3]._vptr_TestInstance + 4) =
       *(undefined8 *)(this->m_refParams).super_ReferenceParams.super_RenderParams.colorScale.m_data
  ;
  *(undefined8 *)((long)&pTVar5[3].m_context + 4) = uVar2;
  uVar2 = *(undefined8 *)
           ((this->m_refParams).super_ReferenceParams.super_RenderParams.colorBias.m_data + 2);
  *(undefined8 *)((long)&pTVar5[4]._vptr_TestInstance + 4) =
       *(undefined8 *)(this->m_refParams).super_ReferenceParams.super_RenderParams.colorBias.m_data;
  *(undefined8 *)((long)&pTVar5[4].m_context + 4) = uVar2;
  pWVar1 = (WrapMode *)((long)&pTVar5[5]._vptr_TestInstance + 4);
  pSVar7 = &(this->m_refParams).super_ReferenceParams.sampler;
  pWVar8 = pWVar1;
  for (lVar6 = 0x14; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pWVar8 = pSVar7->wrapS;
    pSVar7 = (Sampler *)((long)pSVar7 + (ulong)bVar9 * -8 + 4);
    pWVar8 = pWVar8 + (ulong)bVar9 * -2 + 1;
  }
  uVar2 = *(undefined8 *)&(this->m_refParams).maxAnisotropy;
  *(undefined8 *)((long)&pTVar5[10].m_context + 1) =
       *(undefined8 *)((long)&(this->m_refParams).minFilter + 1);
  *(undefined8 *)((long)&pTVar5[10]._vptr_TestInstance + 4) = uVar2;
  util::createSampler((Sampler *)local_358,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      *(FilterMode *)&pTVar5[10].m_context,
                      *(FilterMode *)((long)&pTVar5[10].m_context + 4));
  *(undefined4 *)((long)&pTVar5[7]._vptr_TestInstance + 4) = local_358._32_4_;
  *(undefined8 *)((long)&pTVar5[6]._vptr_TestInstance + 4) = local_358._16_8_;
  *(undefined8 *)((long)&pTVar5[6].m_context + 4) = local_358._24_8_;
  *(undefined8 *)pWVar1 = local_358._0_8_;
  *(undefined8 *)((long)&pTVar5[5].m_context + 4) = local_358._8_8_;
  pTVar5[7].m_context = (Context *)local_358._36_8_;
  pTVar5[8]._vptr_TestInstance = (_func_int **)local_358._44_8_;
  pTVar5[8].m_context = local_324;
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  SVar3 = glu::TextureTestUtil::getSamplerType(format);
  *(SamplerType *)((long)&pTVar5[1]._vptr_TestInstance + 4) = SVar3;
  *(undefined4 *)&pTVar5[1].m_context = 0;
  *(undefined4 *)&pTVar5[9]._vptr_TestInstance = 0;
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_358,vk,physicalDevice);
  fVar10 = *(float *)((long)&pTVar5[10]._vptr_TestInstance + 4);
  if (local_120 <= fVar10) {
    fVar10 = local_120;
  }
  *(float *)((long)&pTVar5[10]._vptr_TestInstance + 4) = fVar10;
  uVar4 = 0;
  if (*(char *)&pTVar5[0xb]._vptr_TestInstance == '\x01') {
    *(undefined8 *)((long)&pTVar5[9]._vptr_TestInstance + 4) = 0x40e0000000000000;
    uVar4 = 7;
  }
  *(undefined4 *)&pTVar5[10]._vptr_TestInstance = uVar4;
  return pTVar5;
}

Assistant:

TestInstance*	createInstance				(Context&	context) const
	{
		return new FilteringAnisotropyInstance(context, m_refParams);
	}